

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

RecyclableObject * __thiscall Js::JavascriptProxy::GetPrototypeSpecial(JavascriptProxy *this)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  code *pcVar3;
  bool bVar4;
  Attributes attributes;
  BOOL BVar5;
  int iVar6;
  HostScriptContext *pHVar7;
  RecyclableObject *pRVar8;
  JavascriptFunction *function;
  undefined4 *puVar9;
  RecyclableObject *pRVar10;
  Type typeId;
  anon_class_32_4_22370477 local_60;
  RecyclableObject *local_40;
  bool local_31;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return (RecyclableObject *)0x0;
  }
  pHVar7 = ThreadContext::GetPreviousHostScriptContext(this_00);
  pSVar2 = pHVar7->scriptContext;
  pRVar8 = MarshalHandler(this,pSVar2);
  if (pRVar8 == (RecyclableObject *)0x0) {
    bVar4 = ThreadContext::RecordImplicitException(this_00);
    if (!bVar4) {
      return (RecyclableObject *)0x0;
    }
    JavascriptError::ThrowTypeError
              ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
                ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ea15,L"getPrototypeOf");
  }
  local_40 = MarshalTarget(this,pSVar2);
  function = GetMethodHelper(this,0x199,pSVar2);
  if ((function == (JavascriptFunction *)0x0) ||
     (bVar4 = ScriptContext::IsHeapEnumInProgress
                        ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                           javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr),
     bVar4)) {
    pRVar8 = (RecyclableObject *)JavascriptObject::GetPrototypeOf(local_40,pSVar2);
    goto LAB_00ba8719;
  }
  local_60.targetObj = local_40;
  local_31 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  local_60.threadContext = this_00;
  local_60.getPrototypeOfMethod = function;
  local_60.handlerObj = pRVar8;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar4 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar4) {
    pRVar8 = (RecyclableObject *)
             GetPrototypeSpecial::anon_class_32_4_22370477::operator()(&local_60);
    bVar4 = ThreadContext::IsOnStack(pRVar8);
LAB_00ba85eb:
    if (bVar4 != false) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      pRVar8 = (RecyclableObject *)
               GetPrototypeSpecial::anon_class_32_4_22370477::operator()(&local_60);
      bVar4 = ThreadContext::IsOnStack(pRVar8);
      goto LAB_00ba85eb;
    }
    IVar1 = this_00->implicitCallFlags;
    pRVar8 = (RecyclableObject *)
             GetPrototypeSpecial::anon_class_32_4_22370477::operator()(&local_60);
    this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    pRVar8 = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                   javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
               super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  this_00->reentrancySafeOrHandled = local_31;
  if (pRVar8 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00ba884b;
    *puVar9 = 0;
  }
  bVar4 = TaggedInt::Is(pRVar8);
  if (bVar4) {
    typeId = TypeIds_FirstNumberType;
  }
  else if ((ulong)pRVar8 >> 0x32 == 0) {
    pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pRVar8);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00ba884b;
      *puVar9 = 0;
    }
    typeId = ((pRVar10->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar5 = RecyclableObject::IsExternal(pRVar10), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) {
LAB_00ba884b:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
  }
  else {
    typeId = TypeIds_Number;
  }
  BVar5 = JavascriptOperators::IsObjectType(typeId);
  pRVar10 = local_40;
  if ((typeId != TypeIds_Null) && (BVar5 == 0)) {
LAB_00ba8837:
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea14,L"getPrototypeOf");
  }
  iVar6 = (*(local_40->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x33])(local_40);
  if (iVar6 == 0) {
    pRVar10 = RecyclableObject::GetPrototype(pRVar10);
    bVar4 = JavascriptConversion::SameValueCommon<false>(pRVar8,pRVar10);
    if (!bVar4) goto LAB_00ba8837;
  }
LAB_00ba8719:
  pRVar8 = VarTo<Js::RecyclableObject>(pRVar8);
  return pRVar8;
}

Assistant:

RecyclableObject* JavascriptProxy::GetPrototypeSpecial()
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return nullptr;
        }

        // Caller does not pass requestContext. Retrieve from host scriptContext stack.
        ScriptContext* requestContext =
            threadContext->GetPreviousHostScriptContext()->GetScriptContext();

        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);
        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return nullptr;
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("getPrototypeOf"));
        }

        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        JavascriptFunction* getPrototypeOfMethod = GetMethodHelper(PropertyIds::getPrototypeOf, requestContext);

        if (nullptr == getPrototypeOfMethod || GetScriptContext()->IsHeapEnumInProgress())
        {
            return VarTo<RecyclableObject>(JavascriptObject::GetPrototypeOf(targetObj, requestContext));
        }

        Var getPrototypeOfResult = threadContext->ExecuteImplicitCall(getPrototypeOfMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, getPrototypeOfMethod, CallInfo(CallFlags_Value, 2), handlerObj, targetObj);
        });

        TypeId prototypeTypeId = JavascriptOperators::GetTypeId(getPrototypeOfResult);
        if (!JavascriptOperators::IsObjectType(prototypeTypeId) && prototypeTypeId != TypeIds_Null)
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getPrototypeOf"));
        }
        if (!targetObj->IsExtensible() && !JavascriptConversion::SameValue(getPrototypeOfResult, targetObj->GetPrototype()))
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getPrototypeOf"));
        }
        return VarTo<RecyclableObject>(getPrototypeOfResult);
    }